

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O3

int rsa_md_to_algor(X509_ALGOR **palg,EVP_MD *md)

{
  int iVar1;
  int extraout_EAX;
  X509_ALGOR *alg;
  
  iVar1 = EVP_MD_type((EVP_MD *)md);
  if (iVar1 - 0x2a0U < 3) {
    alg = X509_ALGOR_new();
    *palg = (X509_ALGOR *)alg;
    iVar1 = 0;
    if (alg != (X509_ALGOR *)0x0) {
      X509_ALGOR_set_md(alg,(EVP_MD *)md);
      iVar1 = 1;
      if (extraout_EAX == 0) {
        X509_ALGOR_free((X509_ALGOR *)*palg);
        *palg = (X509_ALGOR *)0x0;
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  __assert_fail("is_allowed_pss_md(md)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                ,0x51,"int rsa_md_to_algor(X509_ALGOR **, const EVP_MD *)");
}

Assistant:

static int rsa_md_to_algor(X509_ALGOR **palg, const EVP_MD *md) {
  // SHA-1 should be omitted (DEFAULT), but we do not allow SHA-1.
  assert(is_allowed_pss_md(md));
  *palg = X509_ALGOR_new();
  if (*palg == NULL) {
    return 0;
  }
  if (!X509_ALGOR_set_md(*palg, md)) {
    X509_ALGOR_free(*palg);
    *palg = NULL;
    return 0;
  }
  return 1;
}